

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

int __thiscall cmCTestMultiProcessHandler::FindMaxIndex(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_int,_cmCTestMultiProcessHandler::TestSet> *i;
  iterator __end1;
  iterator __begin1;
  TestMap *__range1;
  int max;
  cmCTestMultiProcessHandler *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::begin(&(this->Tests).
                    super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  );
  i = (pair<const_int,_cmCTestMultiProcessHandler::TestSet> *)
      std::
      map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ::end(&(this->Tests).
             super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           );
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator*(&__end1);
    if (__range1._4_4_ < ppVar2->first) {
      __range1._4_4_ = ppVar2->first;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int cmCTestMultiProcessHandler::FindMaxIndex()
{
  int max = 0;
  for (auto const& i : this->Tests) {
    if (i.first > max) {
      max = i.first;
    }
  }
  return max;
}